

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O0

int nn_xreq_send_to(nn_sockbase *self,nn_msg *msg,nn_pipe **to)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  nn_sockbase *local_38;
  int rc;
  nn_pipe **to_local;
  nn_msg *msg_local;
  nn_sockbase *self_local;
  
  local_38 = self;
  if (self == (nn_sockbase *)0x0) {
    local_38 = (nn_sockbase *)0x0;
  }
  iVar1 = nn_lb_send((nn_lb *)(local_38 + 1),msg,to);
  __stream = _stderr;
  if (iVar1 == -0xb) {
    self_local._4_4_ = -0xb;
  }
  else {
    if (iVar1 < 0) {
      pcVar2 = nn_err_strerror(-iVar1);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/xreq.c"
              ,0xad);
      fflush(_stderr);
      nn_err_abort();
    }
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

int nn_xreq_send_to (struct nn_sockbase *self, struct nn_msg *msg,
    struct nn_pipe **to)
{
    int rc;

    /*  If request cannot be sent due to the pushback, drop it silenly. */
    rc = nn_lb_send (&nn_cont (self, struct nn_xreq, sockbase)->lb, msg, to);
    if (nn_slow (rc == -EAGAIN))
        return -EAGAIN;
    errnum_assert (rc >= 0, -rc);

    return 0;
}